

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QList<QTableWidgetItem_*> * __thiscall
QTableWidget::findItems
          (QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableWidget *this,QString *text,
          MatchFlags flags)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  QAbstractItemModel *pQVar4;
  QTableModel *this_00;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QList<QTableWidgetItem_*> *items;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [24];
  QList<QModelIndex> local_90;
  QList<QModelIndex> local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (QModelIndex *)0x0;
  local_78.d.size = 0;
  local_58._forAlignment = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar2 = (**(code **)(**(long **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x2f8) + 0x80))();
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      plVar1 = *(long **)(lVar5 + 0x2f8);
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      local_c0 = 0xffffffffffffffff;
      local_b8 = 0;
      uStack_b0 = 0;
      (**(code **)(*(long *)pQVar4 + 0x60))(local_a8,pQVar4,0,iVar2,&local_c0);
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
      (**(code **)(*plVar1 + 0x150))
                (&local_90,plVar1,local_a8,0,&local_58,0xffffffff,
                 flags.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
                 super_QFlagsStorage<Qt::MatchFlag>.i);
      QList<QModelIndex>::operator+=(&local_78,&local_90);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,0x18,0x10);
        }
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      iVar2 = iVar2 + 1;
      plVar1 = *(long **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                                    super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8 +
                         0x2f8);
      local_58._forAlignment = -NAN;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      iVar3 = (**(code **)(*plVar1 + 0x80))(plVar1,&local_58);
    } while (iVar2 < iVar3);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar6 = (uint)local_78.d.size;
  QList<QTableWidgetItem_*>::reserve(__return_storage_ptr__,(long)(int)uVar6);
  if (0 < (int)uVar6) {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar5 = 0;
    do {
      this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      local_58.shared =
           (PrivateShared *)
           QTableModel::item(this_00,(QModelIndex *)((long)&(local_78.d.ptr)->r + lVar5));
      QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                ((QPodArrayOps<QTableWidgetItem*> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QTableWidgetItem **)&local_58.shared);
      QList<QTableWidgetItem_*>::end(__return_storage_ptr__);
      lVar5 = lVar5 + 0x18;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::findItems(const QString &text, Qt::MatchFlags flags) const
{
    Q_D(const QTableWidget);
    QModelIndexList indexes;
    for (int column = 0; column < columnCount(); ++column)
        indexes += d->model->match(model()->index(0, column, QModelIndex()),
                                     Qt::DisplayRole, text, -1, flags);
    QList<QTableWidgetItem*> items;
    const int indexCount = indexes.size();
    items.reserve(indexCount);
    for (int i = 0; i < indexCount; ++i)
        items.append(d->tableModel()->item(indexes.at(i)));
    return items;
}